

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double sqrt(double __x)

{
  bool bVar1;
  BigNum *in_RSI;
  BigNum *in_RDI;
  double extraout_XMM0_Qa;
  BigNum local_1f0;
  BigNum local_1d0;
  BigNum local_1b0;
  BigNum local_190;
  BigNum local_170;
  BigNum local_150;
  BigNum local_130;
  undefined4 local_10c;
  BigNum local_108;
  BigNum local_e8;
  BigNum local_c8;
  BigNum local_98;
  BigNum local_78;
  BigNum local_58;
  undefined1 local_38 [8];
  BigNum middle;
  BigNum *a_local;
  
  BigNum::BigNum(&local_58,1);
  BigNum::BigNum(&local_98,in_RSI);
  BigNum::BigNum(&local_c8,4);
  operator/(&local_78,&local_98,&local_c8);
  operator+((BigNum *)local_38,&local_58,&local_78);
  BigNum::~BigNum(&local_78);
  BigNum::~BigNum(&local_c8);
  BigNum::~BigNum(&local_98);
  BigNum::~BigNum(&local_58);
  BigNum::BigNum(&local_e8,in_RSI);
  BigNum::BigNum(&local_108,0);
  bVar1 = operator==(&local_e8,&local_108);
  BigNum::~BigNum(&local_108);
  BigNum::~BigNum(&local_e8);
  if (bVar1) {
    BigNum::BigNum(in_RDI,0);
  }
  else {
    BigNum::BigNum(&local_130,in_RSI);
    BigNum::BigNum(&local_150,1);
    bVar1 = operator==(&local_130,&local_150);
    BigNum::~BigNum(&local_150);
    BigNum::~BigNum(&local_130);
    if (bVar1) {
      BigNum::BigNum(in_RDI,1);
    }
    else {
      BigNum::BigNum(&local_170,2);
      BigNum::BigNum(&local_1b0,in_RSI);
      BigNum::BigNum(&local_1d0,2);
      operator/(&local_190,&local_1b0,&local_1d0);
      BigNum::BigNum(&local_1f0,in_RSI);
      binSearch(in_RDI,&local_170,&local_190,&local_1f0);
      BigNum::~BigNum(&local_1f0);
      BigNum::~BigNum(&local_190);
      BigNum::~BigNum(&local_1d0);
      BigNum::~BigNum(&local_1b0);
      BigNum::~BigNum(&local_170);
    }
  }
  local_10c = 1;
  BigNum::~BigNum((BigNum *)local_38);
  return extraout_XMM0_Qa;
}

Assistant:

BigNum sqrt(BigNum a){
    BigNum middle = 1 + (a / 4);
    if (a == 0)
        return 0;
    if (a == 1)
        return 1;
    else
        return binSearch(BigNum(2), a / BigNum(2), a);
}